

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O2

void __thiscall DSDcc::DSDdPMR::processColourCode(DSDdPMR *this,int symbolIndex,int dibit)

{
  int i;
  uint uVar1;
  byte bVar2;
  int n;
  int iVar3;
  double in_XMM0_Qa;
  
  this->m_colourBuffer[symbolIndex] = 1 < dibit;
  if (symbolIndex == 0xb) {
    this->m_colourCode = 0;
    iVar3 = 0;
    bVar2 = 0;
    for (uVar1 = 0xb; uVar1 != 0xffffffff; uVar1 = uVar1 - 1) {
      if (this->m_colourBuffer[uVar1] == '\x01') {
        iVar3 = iVar3 + (1 << (bVar2 & 0x1f));
        this->m_colourCode = iVar3;
      }
      bVar2 = bVar2 + 1;
    }
    DSDLogger::log(&this->m_dsdDecoder->m_dsdLogger,in_XMM0_Qa);
    return;
  }
  return;
}

Assistant:

void DSDdPMR::processColourCode(int symbolIndex, int dibit)
{
    m_colourBuffer[symbolIndex] = (dibit > 1 ? 1 : 0); // 01->0, 11->1 with 00 and 01 on the same positive side and 10 and 11 on the same negative side

    if (symbolIndex == 11) // last symbol
    {
        m_colourCode = 0;

        for (int i = 11, n = 0; i >= 0; i--, n++) // colour code is stored MSB first
        {
            if (m_colourBuffer[i] == 1)
            {
                m_colourCode += (1<<n); // bit is 1
            }
        }

        m_dsdDecoder->getLogger().log("DSDdPMR::processColourCode: %d\n", m_colourCode); // DEBUG
    }
}